

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O2

int sym_request(int pass,char *id,int relative)

{
  sym_t *psVar1;
  int iVar2;
  section_t *psVar3;
  int iVar4;
  int section_id;
  sym_t **ppsVar5;
  
  if (pass != 1) {
    ppsVar5 = &root;
    while (psVar1 = *ppsVar5, psVar1 != (sym_t *)0x0) {
      iVar2 = strcmp(psVar1->id,id);
      if (iVar2 == 0) {
        psVar3 = get_current_section();
        if (psVar1->type != _extern) {
          if (relative == 0) {
            psVar3 = get_section_by_id(psVar1->section_id);
            if (psVar3->type != org) {
              return 0;
            }
            return psVar1->offset + psVar3->offset;
          }
          if (psVar1->section_id != psVar3->id) {
            err(W,"relative jump to a different section");
            add_reloc(psVar1->section_id,psVar3->id,psVar3->pc,relative);
            return 0;
          }
          iVar2 = psVar1->offset - psVar3->pc;
          if (iVar2 - 0x83U < 0xffffff00) {
            err(E,"relative jump to \'%s\' out of range",psVar1->id);
            return 0;
          }
          return iVar2 + -2;
        }
        iVar2 = psVar1->sym_id;
        section_id = psVar3->id;
        iVar4 = psVar3->pc;
        goto LAB_00107f69;
      }
      ppsVar5 = &psVar1->next;
    }
    sym_declare(1,id," ",0,0);
    psVar1 = cur;
    cur->type = _extern;
    iVar2 = psVar1->sym_id;
    section_id = psVar1->section_id;
    iVar4 = psVar1->offset;
LAB_00107f69:
    add_reloc(iVar2,section_id,iVar4 + 1,relative);
    if (relative != 0) {
      err(W,"relative jump to an external address");
    }
  }
  return 0;
}

Assistant:

int sym_request(int pass, char* id, int relative)
{
    sym_t* psym;
    section_t* cursect;
    section_t* targetsect;

    if (pass == READ_PASS)
        return 0;
    
    psym = root;
    while (psym)
    {
        if (strcmp(psym->id, id) == 0)
            break;
        psym = psym->next;
    }

    /* The symbol cannot be found: create it, mark it as imported and add
    a relocation information */
    if (psym == NULL)
    {
        /* Force symbol declaration by simulating the read pass */
        sym_declare(READ_PASS, id, " ", 0, 0);
        cur->type = _extern;
        /* Use offset+1 since all jump instructions are 1 byte long */
        add_reloc(cur->sym_id, cur->section_id, cur->offset+1, relative);
        if (relative)
            err(W, "relative jump to an external address");

        return 0;
    }

    cursect = get_current_section();
    
    /* Imported symbol: add a relocation information */
    if (psym->type == _extern)
    {
        add_reloc(psym->sym_id, cursect->id, cursect->pc+1, relative);
        if (relative)
            err(W, "relative jump to an external address");
        return 0;
    }

    if (relative)
    {
        if (psym->section_id != cursect->id)
        {
            err(W, "relative jump to a different section");
            add_reloc(psym->section_id, cursect->id, cursect->pc, relative);
            return 0;
        }
        else
        {
            int diff = psym->offset - (cursect->pc + 2);
            if (diff > 128 || diff < -127)
            {
                err(E, "relative jump to '%s' out of range", psym->id);
                return 0;
            }
            return diff;
        }
    }


    targetsect = get_section_by_id(psym->section_id);
    if (targetsect->type == org)
        return targetsect->offset + psym->offset;

    TODO("Relocation");

    return 0;
}